

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literal *value)

{
  size_t *this_00;
  bool bVar1;
  uint uVar2;
  int32_t x;
  ulong uVar3;
  Const *value_00;
  element_type *peVar4;
  value_type *pvVar5;
  Expression *value_01;
  Iterator IVar6;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar7;
  bool local_191;
  bool local_149;
  Literal local_128;
  BasicHeapType local_10c;
  HeapType local_108;
  string_view local_100;
  undefined1 local_f0 [8];
  value_type c;
  Iterator __end3;
  Iterator __begin3;
  Literals *__range3;
  string string;
  HeapType local_78;
  uintptr_t local_70;
  string_view local_68;
  uintptr_t local_58;
  Literal local_40;
  Type local_28;
  Type type;
  Literal *value_local;
  Builder *this_local;
  
  local_28.id = (value->type).id;
  type.id = (uintptr_t)value;
  bVar1 = Type::isNumber(&local_28);
  if (bVar1) {
    ::wasm::Literal::Literal(&local_40,value);
    this_local = (Builder *)makeConst(this,&local_40);
    ::wasm::Literal::~Literal(&local_40);
  }
  else {
    bVar1 = wasm::Literal::isNull(value);
    if (bVar1) {
      local_58 = local_28.id;
      this_local = (Builder *)makeRefNull(this,local_28);
    }
    else {
      uVar3 = ::wasm::Type::isFunction();
      if ((uVar3 & 1) == 0) {
        uVar2 = ::wasm::Type::isRef();
        local_149 = false;
        if ((uVar2 & 1) != 0) {
          local_78.id = ::wasm::Type::getHeapType();
          string.field_2._12_4_ = 4;
          local_149 = HeapType::operator==
                                (&local_78,(BasicHeapType *)(string.field_2._M_local_buf + 0xc));
        }
        if (local_149 == false) {
          uVar3 = ::wasm::Type::isString();
          if ((uVar3 & 1) == 0) {
            uVar2 = ::wasm::Type::isRef();
            local_191 = false;
            if ((uVar2 & 1) != 0) {
              local_108.id = ::wasm::Type::getHeapType();
              local_10c = ext;
              local_191 = HeapType::operator==(&local_108,&local_10c);
            }
            if (local_191 == false) {
              uVar2 = ::wasm::Type::isTuple();
              if ((uVar2 & 1) != 0) {
                __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                              ,0x4a6,"Expression *wasm::Builder::makeConstantExpression(Literal)");
              }
              bVar1 = Type::isBasic(&local_28);
              if (bVar1) {
                ::wasm::handle_unreachable
                          ("unsupported constant expression",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                           ,0x4a7);
              }
              __assert_fail("type.isBasic() && \"TODO: handle compound types\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                            ,0x4a6,"Expression *wasm::Builder::makeConstantExpression(Literal)");
            }
            ::wasm::Literal::internalize();
            value_01 = makeConstantExpression(this,&local_128);
            this_local = (Builder *)makeRefAs(this,ExternExternalize,value_01);
            ::wasm::Literal::~Literal(&local_128);
          }
          else {
            std::__cxx11::string::string((string *)&__range3);
            ::wasm::Literal::getGCData();
            this_00 = &__begin3.
                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                       .index;
            peVar4 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_00);
            std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)this_00);
            IVar6 = SmallVector<wasm::Literal,_1UL>::begin
                              (&(peVar4->values).super_SmallVector<wasm::Literal,_1UL>);
            __begin3.
            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            .parent = (SmallVector<wasm::Literal,_1UL> *)
                      IVar6.
                      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      .index;
            __end3.
            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            .index = (size_t)IVar6.
                             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                             .parent;
            IVar7 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                     )SmallVector<wasm::Literal,_1UL>::end
                                (&(peVar4->values).super_SmallVector<wasm::Literal,_1UL>);
            while( true ) {
              __end3.
              super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
              .parent = (SmallVector<wasm::Literal,_1UL> *)IVar7.index;
              c.type.id = (uintptr_t)IVar7.parent;
              bVar1 = SmallVector<wasm::Literal,_1UL>::
                      IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                    *)&__end3.
                                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                       .index,(Iterator *)&c.type);
              if (!bVar1) break;
              pvVar5 = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                                 ((Iterator *)
                                  &__end3.
                                   super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                   .index);
              ::wasm::Literal::Literal((Literal *)local_f0,pvVar5);
              ::wasm::Literal::getInteger();
              std::__cxx11::string::push_back((char)&__range3);
              ::wasm::Literal::~Literal((Literal *)local_f0);
              SmallVector<wasm::Literal,_1UL>::
              IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
              ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                            *)&__end3.
                               super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                               .index);
              IVar7.index = (size_t)__end3.
                                    super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                    .parent;
              IVar7.parent = (SmallVector<wasm::Literal,_1UL> *)c.type.id;
            }
            Name::Name((Name *)&local_100,(string *)&__range3);
            this_local = (Builder *)makeStringConst(this,(Name)local_100);
            std::__cxx11::string::~string((string *)&__range3);
          }
        }
        else {
          x = wasm::Literal::geti31(value,true);
          value_00 = makeConst<int>(this,x);
          this_local = (Builder *)makeI31New(this,(Expression *)value_00);
        }
      }
      else {
        local_68 = (string_view)wasm::Literal::getFunc(value);
        local_70 = ::wasm::Type::getHeapType();
        this_local = (Builder *)makeRefFunc(this,(Name)local_68,(HeapType)local_70);
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

Expression* makeConstantExpression(Literal value) {
    auto type = value.type;
    if (type.isNumber()) {
      return makeConst(value);
    }
    if (value.isNull()) {
      return makeRefNull(type);
    }
    if (type.isFunction()) {
      return makeRefFunc(value.getFunc(), type.getHeapType());
    }
    if (type.isRef() && type.getHeapType() == HeapType::i31) {
      return makeI31New(makeConst(value.geti31()));
    }
    if (type.isString()) {
      // TODO: more than ascii support
      std::string string;
      for (auto c : value.getGCData()->values) {
        string.push_back(c.getInteger());
      }
      return makeStringConst(string);
    }
    if (type.isRef() && type.getHeapType() == HeapType::ext) {
      return makeRefAs(ExternExternalize,
                       makeConstantExpression(value.internalize()));
    }
    TODO_SINGLE_COMPOUND(type);
    WASM_UNREACHABLE("unsupported constant expression");
  }